

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::FBXConverter::FixAnimMeshName
          (string *__return_storage_ptr__,FBXConverter *this,string *name)

{
  ulong uVar1;
  allocator<char> local_11;
  
  if (name->_M_string_length != 0) {
    uVar1 = std::__cxx11::string::find_first_of((char *)name,0x672657);
    if (uVar1 < name->_M_string_length - 2 && uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
      return __return_storage_ptr__;
    }
    if (name->_M_string_length != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"AnimMesh",&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::FixAnimMeshName(const std::string& name) {
            if (name.length()) {
                size_t indexOf = name.find_first_of("::");
                if (indexOf != std::string::npos && indexOf < name.size() - 2) {
                    return name.substr(indexOf + 2);
                }
            }
            return name.length() ? name : "AnimMesh";
        }